

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Periodicity.cpp
# Opt level: O1

Box * __thiscall amrex::Periodicity::Domain(Periodicity *this)

{
  int i;
  long lVar1;
  int iVar2;
  Box *in_RDI;
  
  (in_RDI->smallend).vect[0] = 1;
  (in_RDI->smallend).vect[1] = 1;
  (in_RDI->smallend).vect[2] = 1;
  (in_RDI->bigend).vect[0] = 0;
  (in_RDI->bigend).vect[1] = 0;
  *(undefined8 *)((in_RDI->bigend).vect + 2) = 0;
  lVar1 = 0;
  do {
    iVar2 = (this->period).vect[lVar1];
    if (iVar2 < 1) {
      (in_RDI->smallend).vect[lVar1] = -0x80000000;
      iVar2 = 0x7ffffffe;
    }
    else {
      (in_RDI->smallend).vect[lVar1] = 0;
      iVar2 = iVar2 + -1;
    }
    (in_RDI->bigend).vect[lVar1] = iVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  return in_RDI;
}

Assistant:

Box
Periodicity::Domain () const noexcept
{
    Box pdomain;
    for (int i = 0; i < AMREX_SPACEDIM; ++i) {
        if (isPeriodic(i)) {
            pdomain.setSmall(i,0);
            pdomain.setBig  (i,period[i]-1);
        } else {
            pdomain.setSmall(i, std::numeric_limits<int>::min());
            pdomain.setBig(i, std::numeric_limits<int>::max()-1); // so that it can be nodalized.
        }
    }
    return pdomain;
}